

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
::get_codepoint(lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
                *this)

{
  uint uVar1;
  int iVar2;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *this_00;
  byte bVar3;
  initializer_list<unsigned_int> *in_RDI;
  uint factor;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<unsigned_int> *__range3;
  initializer_list<unsigned_int> factors;
  int codepoint;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *local_48;
  uint local_38 [4];
  initializer_list<unsigned_int> local_28;
  int local_14;
  
  local_14 = 0;
  local_38[0] = 0xc;
  local_38[1] = 8;
  local_38[2] = 4;
  local_38[3] = 0;
  local_28._M_array = local_38;
  local_28._M_len = 4;
  local_48 = (lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
              *)std::initializer_list<unsigned_int>::begin(&local_28);
  this_00 = (lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
             *)std::initializer_list<unsigned_int>::end(in_RDI);
  do {
    if (local_48 == this_00) {
      return local_14;
    }
    uVar1 = *(uint *)&(local_48->ia).current;
    get(this_00);
    bVar3 = (byte)uVar1;
    if ((*(int *)((long)&in_RDI[1]._M_array + 4) < 0x30) ||
       (0x39 < *(int *)((long)&in_RDI[1]._M_array + 4))) {
      if ((*(int *)((long)&in_RDI[1]._M_array + 4) < 0x41) ||
         (0x46 < *(int *)((long)&in_RDI[1]._M_array + 4))) {
        if ((*(int *)((long)&in_RDI[1]._M_array + 4) < 0x61) ||
           (0x66 < *(int *)((long)&in_RDI[1]._M_array + 4))) {
          return -1;
        }
        iVar2 = *(int *)((long)&in_RDI[1]._M_array + 4) + -0x57 << (bVar3 & 0x1f);
      }
      else {
        iVar2 = *(int *)((long)&in_RDI[1]._M_array + 4) + -0x37 << (bVar3 & 0x1f);
      }
    }
    else {
      iVar2 = *(int *)((long)&in_RDI[1]._M_array + 4) + -0x30 << (bVar3 & 0x1f);
    }
    local_14 = iVar2 + local_14;
    local_48 = (lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
                *)((long)&(local_48->ia).current + 4);
  } while( true );
}

Assistant:

int get_codepoint()
    {
        // this function only makes sense after reading `\u`
        JSON_ASSERT(current == 'u');
        int codepoint = 0;

        const auto factors = { 12u, 8u, 4u, 0u };
        for (const auto factor : factors)
        {
            get();

            if (current >= '0' && current <= '9')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x30u) << factor);
            }
            else if (current >= 'A' && current <= 'F')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x37u) << factor);
            }
            else if (current >= 'a' && current <= 'f')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x57u) << factor);
            }
            else
            {
                return -1;
            }
        }

        JSON_ASSERT(0x0000 <= codepoint && codepoint <= 0xFFFF);
        return codepoint;
    }